

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

bool Fossilize::application_info_promote_robustness2(VkApplicationInfo *app_info)

{
  int iVar1;
  char *name;
  char **__end1;
  char **__begin1;
  char *(*__range1) [2];
  VkApplicationInfo *app_info_local;
  
  if ((app_info != (VkApplicationInfo *)0x0) && (app_info->pEngineName != (char *)0x0)) {
    for (__end1 = application_info_promote_robustness2::promote_engine_names;
        __end1 != (char **)&completed_0; __end1 = __end1 + 1) {
      iVar1 = strcmp(*__end1,app_info->pEngineName);
      if (iVar1 == 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool application_info_promote_robustness2(const VkApplicationInfo *app_info)
{
	if (!app_info || !app_info->pEngineName)
		return false;

	static const char *promote_engine_names[] =
	{
		"DXVK",
		"vkd3d",
	};

	for (const char *name : promote_engine_names)
		if (strcmp(name, app_info->pEngineName) == 0)
			return true;

	return false;
}